

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O2

void __thiscall
OpenMD::KirkwoodBuff::collectHistograms
          (KirkwoodBuff *this,StuntDouble *sd1,StuntDouble *sd2,int pairIndex)

{
  int *piVar1;
  char cVar2;
  double dVar3;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if (sd1 != sd2) {
    cVar2 = (((this->super_MultiComponentRDF).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    StuntDouble::getPos((Vector3d *)&local_48,sd1);
    StuntDouble::getPos((Vector3d *)&local_60,sd2);
    operator-(&local_78,&local_60,&local_48);
    Vector<double,_3U>::Vector(&local_90,&local_78);
    if (cVar2 == '\x01') {
      Snapshot::wrapVector((this->super_MultiComponentRDF).currentSnapshot_,(Vector3d *)&local_90);
    }
    dVar3 = Vector<double,_3U>::length(&local_90);
    if (dVar3 < this->len_ + this->deltaR_) {
      piVar1 = (int *)(*(long *)&(this->histograms_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[pairIndex].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)(int)(dVar3 / this->deltaR_) * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void KirkwoodBuff::collectHistograms(StuntDouble* sd1, StuntDouble* sd2,
                                       int pairIndex) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    // Bins are set to the inner radius of a spherical shell.
    if (distance < (len_ + deltaR_)) {
      int whichBin = static_cast<int>(distance / deltaR_);
      histograms_[pairIndex][whichBin] += 1;
    }
  }